

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O1

NaPNEvent __thiscall NaNNRegrPlantLearn::run_net(NaNNRegrPlantLearn *this)

{
  char cVar1;
  NaPNEvent NVar2;
  int iVar3;
  bool bVar4;
  
  bVar4 = (bool)((char)this + '\b');
  cVar1 = NaPetriNet::prepare(bVar4);
  if (cVar1 == '\0') {
    NVar2 = pneError;
    NaPrintLog("IMPORTANT: verification failed!\n");
  }
  else {
    do {
      NVar2 = NaPetriNet::step_alive(bVar4);
      (*this->_vptr_NaNNRegrPlantLearn[5])(this);
    } while (NVar2 == pneAlive);
    iVar3 = (*this->_vptr_NaNNRegrPlantLearn[4])(this);
    if ((char)iVar3 != '\0') {
      NVar2 = pneTerminate;
    }
    NaPetriNet::terminate(bVar4);
  }
  return NVar2;
}

Assistant:

NaPNEvent
NaNNRegrPlantLearn::run_net ()
{
    try{
        // Prepare petri net engine
        if(!net.prepare()){
            NaPrintLog("IMPORTANT: verification failed!\n");
        }
        else{
            NaPNEvent       pnev;

            // Activities cycle
            do{
	      pnev = net.step_alive();

                idle_entry();

            }while(pneAlive == pnev);

            if(user_break())
                pnev = pneTerminate;

            net.terminate();

            return pnev;
        }
    }
    catch(NaException& ex){
        NaPrintLog("EXCEPTION at runtime phase: %s\n", NaExceptionMsg(ex));
    }
    return pneError;
}